

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O3

int __thiscall cmExprParserHelper::ParseString(cmExprParserHelper *this,char *str,int verb)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string e;
  string e_2;
  yyscan_t yyscanner;
  string local_1c0 [4];
  yyscan_t local_140 [13];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined1 local_a0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_80;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  char *local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  undefined1 *local_38;
  
  if (str == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    this->Verbose = verb;
    pcVar2 = (char *)(this->InputBuffer)._M_string_length;
    strlen(str);
    std::__cxx11::string::_M_replace((ulong)&this->InputBuffer,0,pcVar2,(ulong)str);
    this->InputBufferPos = 0;
    this->CurrentLine = 0;
    this->Result = 0;
    cmExpr_yylex_init(local_140);
    cmExpr_yyset_extra((cmCTestResourceGroupsLexerHelper *)this,local_140[0]);
    iVar3 = cmExpr_yyparse(local_140[0]);
    if (iVar3 != 0) {
      local_68 = (this->InputBuffer)._M_dataplus._M_p;
      local_70 = (this->InputBuffer)._M_string_length;
      local_80._M_len = 0x1e;
      local_80._M_str = "cannot parse the expression: \"";
      local_60 = 3;
      local_58 = "\": ";
      local_48 = (this->ErrorString)._M_dataplus._M_p;
      local_50 = (this->ErrorString)._M_string_length;
      local_a8 = local_a0;
      local_b0 = 1;
      local_a0[0] = 0x2e;
      local_40 = 1;
      views._M_len = 5;
      views._M_array = &local_80;
      local_38 = local_a8;
      cmCatViews_abi_cxx11_(local_1c0,views);
      paVar1 = &local_1c0[0].field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0[0]._M_dataplus._M_p == paVar1) {
        local_c8._8_8_ = local_1c0[0].field_2._8_8_;
        local_d8 = &local_c8;
      }
      else {
        local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_1c0[0]._M_dataplus._M_p;
      }
      local_c8._M_allocated_capacity._1_7_ = local_1c0[0].field_2._M_allocated_capacity._1_7_;
      local_c8._M_local_buf[0] = local_1c0[0].field_2._M_local_buf[0];
      local_d0 = local_1c0[0]._M_string_length;
      local_1c0[0]._M_string_length = 0;
      local_1c0[0].field_2._M_local_buf[0] = '\0';
      local_1c0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::operator=((string *)&this->ErrorString,(string *)&local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c0[0]._M_dataplus._M_p,
                        CONCAT71(local_1c0[0].field_2._M_allocated_capacity._1_7_,
                                 local_1c0[0].field_2._M_local_buf[0]) + 1);
      }
    }
    cmExpr_yylex_destroy(local_140[0]);
    iVar3 = 0;
    if (((this->ErrorString)._M_string_length == 0) && (iVar3 = 1, this->Verbose != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expanding [",0xb);
      sVar4 = strlen(str);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,str,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] produced: [",0xd);
      poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  return iVar3;
}

Assistant:

int cmExprParserHelper::ParseString(const char* str, int verb)
{
  if (!str) {
    return 0;
  }
  // printf("Do some parsing: %s\n", str);

  this->Verbose = verb;
  this->InputBuffer = str;
  this->InputBufferPos = 0;
  this->CurrentLine = 0;

  this->Result = 0;

  yyscan_t yyscanner;
  cmExpr_yylex_init(&yyscanner);
  cmExpr_yyset_extra(this, yyscanner);

  try {
    int res = cmExpr_yyparse(yyscanner);
    if (res != 0) {
      std::string e =
        cmStrCat("cannot parse the expression: \"", this->InputBuffer,
                 "\": ", this->ErrorString, '.');
      this->SetError(std::move(e));
    }
  } catch (std::runtime_error const& fail) {
    std::string e = cmStrCat("cannot evaluate the expression: \"",
                             this->InputBuffer, "\": ", fail.what(), '.');
    this->SetError(std::move(e));
  } catch (std::out_of_range const&) {
    std::string e = "cannot evaluate the expression: \"" + this->InputBuffer +
      "\": a numeric value is out of range.";
    this->SetError(std::move(e));
  } catch (...) {
    std::string e =
      "cannot parse the expression: \"" + this->InputBuffer + "\".";
    this->SetError(std::move(e));
  }
  cmExpr_yylex_destroy(yyscanner);
  if (!this->ErrorString.empty()) {
    return 0;
  }

  if (this->Verbose) {
    std::cerr << "Expanding [" << str << "] produced: [" << this->Result << "]"
              << std::endl;
  }
  return 1;
}